

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

CScript * GetScriptForMultisig
                    (CScript *__return_storage_ptr__,int nRequired,
                    vector<CPubKey,_std::allocator<CPubKey>_> *keys)

{
  uint uVar1;
  pointer pCVar2;
  uint uVar3;
  void *pvVar4;
  pointer in;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  pointer pCVar6;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  CScript::push_int64(__return_storage_ptr__,(long)nRequired);
  in = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  pCVar2 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar6 = in;
  if (in != pCVar2) {
    do {
      ToByteVector<CPubKey>(&local_48,in);
      CScript::operator<<(__return_storage_ptr__,&local_48);
      pvVar4 = (void *)CONCAT71(local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_48.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar4);
      }
      in = in + 1;
    } while (in != pCVar2);
    in = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pCVar6 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  this = &CScript::push_int64(__return_storage_ptr__,((long)in - (long)pCVar6) * 0xfc0fc0fc0fc0fc1)
          ->super_CScriptBase;
  uVar1 = this->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar5 = this;
  }
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this,(uchar *)((long)&ppVar5->_union + (long)(int)uVar3),(uchar *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

CScript GetScriptForMultisig(int nRequired, const std::vector<CPubKey>& keys)
{
    CScript script;

    script << nRequired;
    for (const CPubKey& key : keys)
        script << ToByteVector(key);
    script << keys.size() << OP_CHECKMULTISIG;

    return script;
}